

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O3

void __thiscall moira::Moira::fullPrefetch<4ul,0>(Moira *this)

{
  uint addr;
  u32 uVar1;
  u32 uVar2;
  AEStackFrame frame;
  
  addr = (this->reg).pc;
  if ((addr & 1) == 0) {
    uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,addr);
    (this->queue).irc = (u16)uVar1;
    uVar2 = (this->reg).pc;
    (this->reg).pc0 = uVar2;
    (this->queue).ird = (u16)uVar1;
    uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar2;
    return;
  }
  frame = makeFrame<0ul>(this,addr);
  execAddressError(this,frame,2);
  return;
}

Assistant:

void
Moira::fullPrefetch()
{    
    // Check for address error
    if (misaligned(reg.pc)) {
        execAddressError(makeFrame(reg.pc), 2);
        return;
    }

    queue.irc = readM<MEM_PROG, Word>(reg.pc);
    if (delay) sync(delay);
    prefetch<F>();
}